

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringVisitor.cpp
# Opt level: O1

void __thiscall binlog::ToStringVisitor::visit(ToStringVisitor *this,Enum e)

{
  string_view *psVar1;
  size_t in_RCX;
  size_t __n;
  OstreamBuffer *this_00;
  
  comma(this);
  if (e.enumerator._len == 0) {
    this_00 = this->_out;
    detail::OstreamBuffer::write(this_00,0x10bab1,(void *)0x2,in_RCX);
    psVar1 = &e.value;
    __n = 0x30;
  }
  else {
    psVar1 = &e.enumerator;
    this_00 = this->_out;
    __n = 0x18;
  }
  detail::OstreamBuffer::write(this_00,(int)psVar1->_ptr,*(void **)((long)&e.name._ptr + __n),__n);
  return;
}

Assistant:

void ToStringVisitor::visit(mserialize::Visitor::Enum e)
{
  comma();
  if (e.enumerator.empty())
  {
    _out << "0x" << e.value;
  }
  else
  {
    _out << e.enumerator;
  }
}